

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_analysis.cc
# Opt level: O0

void __thiscall
pass_check_combinational_loop_Test::TestBody(pass_check_combinational_loop_Test *this)

{
  undefined1 this_00 [8];
  bool bVar1;
  Generator *this_01;
  Var *this_02;
  Const *var;
  char *message;
  AssertHelper local_230;
  Message local_228 [2];
  StmtException *anon_var_0;
  type e;
  undefined1 auStack_1e8 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  undefined1 local_1c0 [39];
  allocator<char> local_199;
  string local_198;
  Var *local_178;
  Var *a;
  allocator<char> local_159;
  string local_158;
  undefined1 local_138 [8];
  Generator *mod;
  Context c;
  pass_check_combinational_loop_Test *this_local;
  
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  this_01 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = (undefined1  [8])this_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"a",&local_199);
  this_02 = kratos::Generator::var(this_01,&local_198,1);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  this_00 = local_138;
  local_178 = this_02;
  var = kratos::constant(1,1,false);
  kratos::Var::operator+(this_02,&var->super_Var);
  kratos::Var::assign((Var *)local_1c0,this_02);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_1c0 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_1c0);
  kratos::Generator::add_stmt((Generator *)this_00,(shared_ptr<kratos::Stmt> *)(local_1c0 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_1c0 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_1c0);
  kratos::fix_assignment_type((Generator *)local_138);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_1e8[0] = (_Alloc_hider)0x0;
  stack0xfffffffffffffe19 = 0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_1e8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_1e8);
  if (bVar1) {
    e._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      kratos::check_combinational_loop((Generator *)local_138);
    }
    if ((e._7_1_ & 1) != 0) goto LAB_0013d24f;
    std::__cxx11::string::operator=
              ((string *)auStack_1e8,
               "Expected: check_combinational_loop(&mod) throws an exception of type StmtException.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_228);
  message = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_230,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_analysis.cc"
             ,0x7c,message);
  testing::internal::AssertHelper::operator=(&local_230,local_228);
  testing::internal::AssertHelper::~AssertHelper(&local_230);
  testing::Message::~Message(local_228);
LAB_0013d24f:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_1e8);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(pass, check_combinational_loop) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto &a = mod.var("a", 1);
    mod.add_stmt(a.assign(a + constant(1, 1)));
    fix_assignment_type(&mod);

    EXPECT_THROW(check_combinational_loop(&mod), StmtException);
}